

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_float_push_back(ImVector_float *self,float v)

{
  int iVar1;
  float *__dest;
  int iVar2;
  int iVar3;
  
  iVar1 = self->Capacity;
  if (self->Size == iVar1) {
    iVar3 = self->Size + 1;
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar1 < iVar3) {
      __dest = (float *)ImGui::MemAlloc((long)iVar3 << 2);
      if (self->Data != (float *)0x0) {
        memcpy(__dest,self->Data,(long)self->Size << 2);
        ImGui::MemFree(self->Data);
      }
      self->Data = __dest;
      self->Capacity = iVar3;
    }
  }
  self->Data[self->Size] = v;
  self->Size = self->Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImVector_float_push_back(ImVector_float* self,const float v)
{
    return self->push_back(v);
}